

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::TextureViewVkImpl::TextureViewVkImpl
          (TextureViewVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          TextureViewDesc *ViewDesc,ITexture *pTexture,ImageViewWrapper *ImgView,bool bIsDefaultView
          )

{
  bool bIsDefaultView_local;
  ImageViewWrapper *ImgView_local;
  ITexture *pTexture_local;
  TextureViewDesc *ViewDesc_local;
  RenderDeviceVkImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  TextureViewVkImpl *this_local;
  
  TextureViewBase<Diligent::EngineVkImplTraits>::TextureViewBase
            (&this->super_TextureViewBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,
             ViewDesc,pTexture,bIsDefaultView,false);
  (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
  .super_ObjectBase<Diligent::ITextureViewVk>.super_RefCountedObject<Diligent::ITextureViewVk>.
  super_ITextureViewVk.super_ITextureView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_0139efb0;
  VulkanUtilities::VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5>::
  VulkanObjectWrapper(&this->m_ImageView,ImgView);
  return;
}

Assistant:

TextureViewVkImpl::TextureViewVkImpl(IReferenceCounters*                 pRefCounters,
                                     RenderDeviceVkImpl*                 pDevice,
                                     const TextureViewDesc&              ViewDesc,
                                     ITexture*                           pTexture,
                                     VulkanUtilities::ImageViewWrapper&& ImgView,
                                     bool                                bIsDefaultView) :
    // clang-format off
    TTextureViewBase
    {
        pRefCounters,
        pDevice,
        ViewDesc,
        pTexture,
        bIsDefaultView
    },
    m_ImageView{std::move(ImgView)}
// clang-format on
{
}